

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> * __thiscall
QPDF::getAllObjects(vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>
                    *__return_storage_ptr__,QPDF *this)

{
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  QPDFObjectHandle local_40;
  
  fixDanglingReferences(this,false);
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  p_Var4 = *(_Base_ptr *)((long)&(_Var1._M_head_impl)->obj_cache + 0x18);
  p_Var5 = (_Base_ptr)((long)&(_Var1._M_head_impl)->obj_cache + 8);
  if (p_Var4 != p_Var5) {
    do {
      p_Var2 = *(_Base_ptr *)(p_Var4 + 1);
      p_Var3 = p_Var4[1]._M_parent;
      p_Var3[2]._M_parent = (_Base_ptr)this;
      p_Var3[2]._M_left = p_Var2;
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)p_Var4[1]._M_parent;
      local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var4[1]._M_left;
      if ((_Base_ptr)
          local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Base_ptr)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&((_Base_ptr)
                   local_40.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_parent =
               *(int *)&((_Base_ptr)
                        local_40.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_M_parent + 1;
          UNLOCK();
        }
        else {
          *(int *)&((_Base_ptr)
                   local_40.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                   _M_parent =
               *(int *)&((_Base_ptr)
                        local_40.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                        )->_M_parent + 1;
        }
      }
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::
      emplace_back<QPDFObjectHandle>(__return_storage_ptr__,&local_40);
      if ((_Base_ptr)
          local_40.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Base_ptr)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_40.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != p_Var5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFObjectHandle>
QPDF::getAllObjects()
{
    // After fixDanglingReferences is called, all objects are in the object cache.
    fixDanglingReferences();
    std::vector<QPDFObjectHandle> result;
    for (auto const& iter: m->obj_cache) {
        result.push_back(newIndirect(iter.first, iter.second.object));
    }
    return result;
}